

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::DescriptorProto_ReservedRange::_InternalParse
          (DescriptorProto_ReservedRange *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  Arena *metadata;
  uint64 uVar2;
  EpsCopyInputStream *in_RDX;
  char *in_RSI;
  ParseContext *in_RDI;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  char **in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  HasBits in_stack_ffffffffffffffd4;
  char *local_20;
  
  memset(&stack0xffffffffffffffd4,0,4);
  metadata = GetArenaNoVirtual((DescriptorProto_ReservedRange *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_20 = in_RSI;
  do {
    while( true ) {
      bVar1 = internal::ParseContext::Done
                        ((ParseContext *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0050b111;
      local_20 = internal::ReadTag((char *)in_RDX,
                                   (uint32 *)
                                   CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                            in_stack_ffffffffffffffd0),
                                   (uint32)((ulong)metadata >> 0x20));
      if (local_20 == (char *)0x0) goto LAB_0050b12e;
      in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffc4 >> 3;
      if (in_stack_ffffffffffffffb4 != 1) break;
      if ((in_stack_ffffffffffffffc4 & 0xff) == 8) {
        _Internal::set_has_start((HasBits *)&stack0xffffffffffffffd4);
        uVar2 = internal::ReadVarint
                          ((char **)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        (in_RDI->super_EpsCopyInputStream).size_ = (int)uVar2;
      }
      else {
LAB_0050b0b3:
        if (((in_stack_ffffffffffffffc4 & 7) == 4) || (in_stack_ffffffffffffffc4 == 0)) {
          internal::EpsCopyInputStream::SetLastTag(in_RDX,in_stack_ffffffffffffffc4);
          goto LAB_0050b111;
        }
        local_20 = internal::UnknownFieldParse
                             ((uint32)in_stack_ffffffffffffffd4.has_bits_[0],
                              (InternalMetadataWithArena *)metadata,
                              (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_RDI);
      }
      if (local_20 == (char *)0x0) goto LAB_0050b12e;
    }
    if ((in_stack_ffffffffffffffb4 != 2) || ((in_stack_ffffffffffffffc4 & 0xff) != 0x10))
    goto LAB_0050b0b3;
    _Internal::set_has_end((HasBits *)&stack0xffffffffffffffd4);
    uVar2 = internal::ReadVarint
                      ((char **)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    (in_RDI->super_EpsCopyInputStream).limit_ = (int)uVar2;
  } while (local_20 != (char *)0x0);
LAB_0050b12e:
  local_20 = (char *)0x0;
LAB_0050b111:
  internal::HasBits<1UL>::Or
            ((HasBits<1UL> *)&(in_RDI->super_EpsCopyInputStream).next_chunk_,
             (HasBits<1UL> *)&stack0xffffffffffffffd4);
  return local_20;
}

Assistant:

const char* DescriptorProto_ReservedRange::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional int32 start = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_start(&has_bits);
          start_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 end = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}